

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_comm.cpp
# Opt level: O0

CommPtr __thiscall Omega_h::Comm::graph(Comm *this,Read<int> *dsts)

{
  Comm *this_00;
  ulong *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  CommPtr CVar1;
  Read<int> *dsts_local;
  Comm *this_local;
  ulong local_10;
  
  this_00 = (Comm *)operator_new(0x50);
  if ((*in_RDX & 1) == 0) {
    local_10 = *(ulong *)*in_RDX;
  }
  else {
    local_10 = *in_RDX >> 3;
  }
  Comm(this_00,(Library *)(dsts->write_).shared_alloc_.alloc,true,(int)(local_10 >> 2) == 1);
  std::shared_ptr<Omega_h::Comm>::shared_ptr<Omega_h::Comm,void>
            ((shared_ptr<Omega_h::Comm> *)this,this_00);
  CVar1.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  CVar1.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (CommPtr)CVar1.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

CommPtr Comm::graph(Read<I32> dsts) const {
#ifdef OMEGA_H_USE_MPI
  HostRead<I32> h_destinations(dsts);
  auto v_sources = sources_from_destinations(impl_, h_destinations);
  HostWrite<I32> h_sources(int(v_sources.size()));
  for (int i = 0; i < h_sources.size(); ++i)
    h_sources[i] = v_sources[std::size_t(i)];
  MPI_Comm impl2;
  CALL(MPI_Comm_dup(impl_, &impl2));
  return CommPtr(new Comm(library_, impl2, h_sources.write(), dsts));
#else
  return CommPtr(new Comm(library_, true, dsts.size() == 1));
#endif
}